

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureFormatTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles3::Functional::Texture3DFormatCase::iterate(Texture3DFormatCase *this)

{
  int iVar1;
  bool bVar2;
  qpTestResult qVar3;
  int iVar4;
  Texture3D *this_00;
  bool isOk;
  Texture3DFormatCase *this_local;
  
  bVar2 = testSlice(this,this->m_curSlice);
  if ((!bVar2) &&
     (qVar3 = tcu::TestContext::getTestResult((this->super_TestCase).super_TestNode.m_testCtx),
     qVar3 == QP_TEST_RESULT_PASS)) {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
               "Image comparison failed");
  }
  this->m_curSlice = this->m_curSlice + 1;
  iVar1 = this->m_curSlice;
  this_00 = glu::Texture3D::getRefTexture(this->m_texture);
  iVar4 = tcu::Texture3D::getDepth(this_00);
  return (uint)(iVar1 < iVar4);
}

Assistant:

Texture3DFormatCase::IterateResult Texture3DFormatCase::iterate (void)
{
	// Execute test for all slices.
	bool isOk = testSlice(m_curSlice);

	if (!isOk && m_testCtx.getTestResult() == QP_TEST_RESULT_PASS)
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Image comparison failed");

	m_curSlice += 1;

	return m_curSlice < m_texture->getRefTexture().getDepth() ? CONTINUE : STOP;
}